

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrdopt.c
# Opt level: O0

void read_Xoption(int *argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  int *piVar6;
  int local_55c;
  int i;
  Display *xdisplay;
  char *envname;
  char tmp [1024];
  char *str_type [30];
  uint local_50 [2];
  XrmValue value;
  XrmDatabase rDB;
  XrmDatabase serverDB;
  XrmDatabase applicationDB;
  XrmDatabase commandlineDB;
  char **ppcStack_18;
  int bitmask;
  char **argv_local;
  int *argc_local;
  
  applicationDB = (XrmDatabase)0x0;
  value.addr = (XPointer)0x0;
  ppcStack_18 = argv;
  argv_local = (char **)argc;
  for (local_55c = 1; local_55c < *(int *)argv_local; local_55c = local_55c + 1) {
    if ((ppcStack_18[local_55c] != (char *)0x0) &&
       ((iVar1 = strcmp(ppcStack_18[local_55c],"-help"), iVar1 == 0 ||
        (iVar1 = strcmp(ppcStack_18[local_55c],"-HELP"), iVar1 == 0)))) {
      print_Xusage(*ppcStack_18);
      exit(0);
    }
  }
  XrmInitialize();
  XrmParseCommand(&applicationDB,opTable,0x21,"ldex",argv_local,ppcStack_18);
  iVar1 = XrmGetResource(applicationDB,"ldex.help","Ldex.Help",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    print_Xusage(*ppcStack_18);
  }
  iVar1 = XrmGetResource(applicationDB,"ldex.sysout","Ldex.Sysout",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy(sysout_name_cl,(char *)value._0_8_,(ulong)local_50[0]);
  }
  iVar1 = XrmGetResource(applicationDB,"ldex.display","Ldex.Display",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy(Display_Name,(char *)value._0_8_,(ulong)local_50[0]);
  }
  else {
    pcVar5 = getenv("DISPLAY");
    if (pcVar5 == (char *)0x0) {
      fprintf(_stderr,"Can\'t find a display. Either set the shell\n");
      fprintf(_stderr,"variable DISPLAY to an appropriate display\n");
      fprintf(_stderr,"or provide a -display argument.\n");
      print_Xusage(*ppcStack_18);
    }
    else {
      pcVar5 = getenv("DISPLAY");
      strcpy(Display_Name,pcVar5);
    }
  }
  lVar2 = XOpenDisplay(Display_Name);
  __stream = _stderr;
  if (lVar2 == 0) {
    uVar4 = XDisplayName(Display_Name);
    fprintf(__stream,"Open_Display: cannot connect to display %s.",uVar4);
    exit(-1);
  }
  strcpy((char *)&envname,"/usr/lib/X11/app-defaults/");
  strcat((char *)&envname,"medley");
  lVar3 = XrmGetFileDatabase(&envname);
  if (lVar3 != 0) {
    XrmMergeDatabases(lVar3,&value.addr);
  }
  lVar3 = XResourceManagerString(lVar2);
  if (lVar3 != 0) {
    uVar4 = XResourceManagerString(lVar2);
    lVar3 = XrmGetStringDatabase(uVar4);
    if (lVar3 != 0) {
      XrmMergeDatabases(lVar3,&value.addr);
    }
  }
  XCloseDisplay(lVar2);
  pcVar5 = getenv("HOME");
  strcat((char *)&envname,pcVar5);
  strcat((char *)&envname,"/.Xdefaults");
  iVar1 = access((char *)&envname,4);
  if ((iVar1 != 0) && (lVar2 = XrmGetFileDatabase(&envname), lVar2 != 0)) {
    XrmMergeDatabases(lVar2,&value.addr);
  }
  XrmMergeDatabases(applicationDB,&value.addr);
  iVar1 = XrmGetResource(value.addr,"ldex.sysout","Ldex.Sysout",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy(sysout_name_xrm,(char *)value._0_8_,(ulong)local_50[0]);
  }
  iVar1 = XrmGetResource(value.addr,"ldex.title","Ldex.Title",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy(windowTitle,(char *)value._0_8_,0xfe);
  }
  else {
    strncpy(windowTitle,"Medley Interlisp",0xfe);
  }
  iVar1 = XrmGetResource(value.addr,"ldex.icontitle","Ldex.icontitle",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy(iconTitle,(char *)value._0_8_,(ulong)local_50[0]);
  }
  else {
    strcpy(iconTitle,"Medley");
  }
  iVar1 = XrmGetResource(value.addr,"ldex.iconbitmap","Ldex.Iconbitmap",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy(iconpixmapfile,(char *)value._0_8_,(ulong)local_50[0]);
  }
  iVar1 = XrmGetResource(value.addr,"ldex.geometry","Ldex.geometry",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy((char *)&envname,(char *)value._0_8_,(ulong)local_50[0]);
    commandlineDB._4_4_ =
         XParseGeometry(&envname,&LispWindowRequestedX,&LispWindowRequestedY,
                        &LispWindowRequestedWidth,&LispWindowRequestedHeight);
  }
  iVar1 = XrmGetResource(value.addr,"ldex.screen","Ldex.screen",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy((char *)&envname,(char *)value._0_8_,(ulong)local_50[0]);
    commandlineDB._4_4_ =
         XParseGeometry(&envname,&LispDisplayRequestedX,&LispDisplayRequestedY,
                        &LispDisplayRequestedWidth,&LispDisplayRequestedHeight);
  }
  strcpy((char *)&envname,"");
  iVar1 = XrmGetResource(value.addr,"ldex.cursorColor","Ldex.cursorColor",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy(cursorColor,(char *)value._0_8_,0xfe);
  }
  iVar1 = XrmGetResource(value.addr,"ldex.foreground","Ldex.foreground",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy(foregroundColorName,(char *)value._0_8_,0x3f);
  }
  iVar1 = XrmGetResource(value.addr,"ldex.background","Ldex.background",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy(backgroundColorName,(char *)value._0_8_,0x3f);
  }
  iVar1 = XrmGetResource(value.addr,"ldex.NoFork","Ldex.NoFork",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    please_fork = 0;
  }
  iVar1 = XrmGetResource(value.addr,"ldex.noscroll","Ldex.noscroll",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    noscroll = 1;
  }
  iVar1 = XrmGetResource(value.addr,"ldex.timer","Ldex.timer",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy((char *)&envname,(char *)value._0_8_,(ulong)local_50[0]);
    piVar6 = __errno_location();
    *piVar6 = 0;
    lVar2 = strtol((char *)&envname,(char **)0x0,10);
    piVar6 = __errno_location();
    if ((*piVar6 == 0) && (0 < (int)lVar2)) {
      TIMER_INTERVAL = (int)lVar2;
    }
  }
  iVar1 = XrmGetResource(value.addr,"ldex.memory","Ldex.memory",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    strncpy((char *)&envname,(char *)value._0_8_,(ulong)local_50[0]);
    piVar6 = __errno_location();
    *piVar6 = 0;
    lVar2 = strtol((char *)&envname,(char **)0x0,10);
    piVar6 = __errno_location();
    if ((*piVar6 == 0) && (0 < (int)(uint)lVar2)) {
      sysout_size = (uint)lVar2;
    }
  }
  iVar1 = XrmGetResource(value.addr,"ldex.Init","Ldex.Init",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    for_makeinit = 1;
  }
  iVar1 = XrmGetResource(value.addr,"ldex.xsync","Ldex.xsync",tmp + 0x3f8,local_50);
  if (iVar1 == 1) {
    xsync = 1;
  }
  return;
}

Assistant:

void read_Xoption(int *argc, char *argv[])
{
  int bitmask;
  XrmDatabase commandlineDB = NULL, applicationDB, serverDB, rDB = NULL;
  XrmValue value;
  char *str_type[30], tmp[1024], *envname;
  Display *xdisplay;
  int i;

  /**********************************************/
  /*                                            */
  /*  Take care of -help flag, which            */
  /*  isn't handled correctly by the X code.    */
  /*                                            */
  /**********************************************/

  for (i = 1; i < *argc; i++) {
    if (argv[i] && ((strcmp(argv[i], "-help") == 0) || (strcmp(argv[i], "-HELP") == 0))) {
      print_Xusage(argv[0]);
      exit(0);
    }
  }

  /* Now let X handle the parsing. */

  (void)XrmInitialize();
/* If the first argv lacks '-' in front it is the sysout. */
#ifdef NEVEFR
  /* JDS 12/20/01: app name should always be "ldex", not what's in argv?? */
  XrmParseCommand(&commandlineDB, opTable, opTableEntries, argv[0], argc, argv);
#endif
  XrmParseCommand(&commandlineDB, opTable, sizeof(opTable) / sizeof(opTable[0]), "ldex", argc, argv);

  if (XrmGetResource(commandlineDB, "ldex.help", "Ldex.Help", str_type, &value) == True) {
    print_Xusage(argv[0]);
  }

  if (XrmGetResource(commandlineDB, "ldex.sysout", "Ldex.Sysout", str_type, &value) == True) {
    /* Get Sysout from command line only */
    (void)strncpy(sysout_name_cl, value.addr, value.size);
  }

  /* In order to access other DB's we have to open the main display now */
  /* This is just temporary. We'll need this display struct to open the */
  /* main databases for medley. After it is used the display will be */
  /* closed and the opening of the other displays will follow the standard */
  /* protocol. */

  if (XrmGetResource(commandlineDB, "ldex.display", "Ldex.Display", str_type, &value) == True) {
    (void)strncpy(Display_Name, value.addr, value.size);
  } else if (getenv("DISPLAY") == (char *)NULL) {
    (void)fprintf(stderr, "Can't find a display. Either set the shell\n");
    (void)fprintf(stderr, "variable DISPLAY to an appropriate display\n");
    (void)fprintf(stderr, "or provide a -display argument.\n");
    print_Xusage(argv[0]);
  } else {
    envname = getenv("DISPLAY");
    (void)strcpy(Display_Name, envname);
  }
  if ((xdisplay = XOpenDisplay(Display_Name)) != NULL) {
    /* read the other databases */
    /* Start with app-defaults/medley */
    (void)strcpy(tmp, "/usr/lib/X11/app-defaults/");
    (void)strcat(tmp, "medley");
    applicationDB = XrmGetFileDatabase(tmp);
    if (applicationDB != NULL) { (void)XrmMergeDatabases(applicationDB, &rDB); }
    /* Then try the displays defaults */
    if (XResourceManagerString(xdisplay) != NULL) {
      serverDB = XrmGetStringDatabase(XResourceManagerString(xdisplay));
      if (serverDB != NULL) { (void)XrmMergeDatabases(serverDB, &rDB); }
    }
    XCloseDisplay(xdisplay);
  } else {
    (void)fprintf(stderr, "Open_Display: cannot connect to display %s.", XDisplayName(Display_Name));
    exit(-1);
  }

  envname = getenv("HOME");
  (void)strcat(tmp, envname);
  (void)strcat(tmp, "/.Xdefaults");
  if (access(tmp, R_OK) != 0) {
    serverDB = XrmGetFileDatabase(tmp);
    if (serverDB != NULL) { (void)XrmMergeDatabases(serverDB, &rDB); }
  }

  /* Now for the commandline */
  (void)XrmMergeDatabases(commandlineDB, &rDB);

  if (XrmGetResource(rDB, "ldex.sysout", "Ldex.Sysout", str_type, &value) == True) {
    /* Get Sysout from x resource manager */
    (void)strncpy(sysout_name_xrm, value.addr, value.size);
  }

  if (XrmGetResource(rDB, "ldex.title", "Ldex.Title", str_type, &value) == True) {
    (void)strncpy(windowTitle, value.addr, sizeof(windowTitle) - 1);
  } else {
    (void)strncpy(windowTitle, WINDOW_NAME, sizeof(windowTitle) - 1);
  }
  if (XrmGetResource(rDB, "ldex.icontitle", "Ldex.icontitle", str_type, &value) == True) {
    (void)strncpy(iconTitle, value.addr, value.size);
  } else {
    (void)strcpy(iconTitle, "Medley");
  }

  if (XrmGetResource(rDB, "ldex.iconbitmap", "Ldex.Iconbitmap", str_type, &value) == True) {
    (void)strncpy(iconpixmapfile, value.addr, value.size);
  }

  /* Old style geometry definition. */
  if (XrmGetResource(rDB, "ldex.geometry", "Ldex.geometry", str_type, &value) == True) {
    /* Get Geometry */
    (void)strncpy(tmp, value.addr, value.size);
    bitmask = XParseGeometry(tmp, &LispWindowRequestedX, &LispWindowRequestedY,
                             &LispWindowRequestedWidth, &LispWindowRequestedHeight);
  }
  if (XrmGetResource(rDB, "ldex.screen", "Ldex.screen", str_type, &value) == True) {
    /* Get Geometry */
    (void)strncpy(tmp, value.addr, value.size);
    bitmask = XParseGeometry(tmp, &LispDisplayRequestedX, &LispDisplayRequestedY,
                             &LispDisplayRequestedWidth, &LispDisplayRequestedHeight);
  }

  (void)strcpy(tmp, ""); /* Clear the string */

  if (XrmGetResource(rDB, "ldex.cursorColor", "Ldex.cursorColor", str_type, &value) == True) {
    (void)strncpy(cursorColor, value.addr, sizeof(cursorColor) - 1);
  }

  if (XrmGetResource(rDB, "ldex.foreground", "Ldex.foreground", str_type, &value) == True) {
    (void)strncpy(foregroundColorName, value.addr, sizeof(foregroundColorName) - 1);
  }

  if (XrmGetResource(rDB, "ldex.background", "Ldex.background", str_type, &value) == True) {
    (void)strncpy(backgroundColorName, value.addr, sizeof(backgroundColorName) - 1);
  }

  if (XrmGetResource(rDB, "ldex.NoFork", "Ldex.NoFork", str_type, &value) == True) {
    please_fork = 0;
  }

  if (XrmGetResource(rDB, "ldex.noscroll", "Ldex.noscroll", str_type, &value) == True) {
    noscroll = 1;
  }

  if (XrmGetResource(rDB, "ldex.timer", "Ldex.timer", str_type, &value) == True) {
    (void)strncpy(tmp, value.addr, value.size);
    errno = 0;
    i = (int)strtol(tmp, (char **)NULL, 10);
    if (errno == 0 && i > 0)
      TIMER_INTERVAL = i;
  }

  /*    if (XrmGetResource(rDB,
                         "ldex.maxpages",
                         "Ldex.maxpages",
                         str_type, &value) == True) {
        (void)strncpy(tmp, value.addr, value.size);
        maxpages = (unsigned)strtol((tmp, (char **)NULL, 10);
	// should check no error here 
      }
  */
  if (XrmGetResource(rDB, "ldex.memory", "Ldex.memory", str_type, &value) == True) {
    (void)strncpy(tmp, value.addr, value.size);
    errno = 0;
    i = (int)strtol(tmp, (char **)NULL, 10);
    if (errno == 0 && i > 0)
      sysout_size = (unsigned)i;
  }

  if (XrmGetResource(rDB, "ldex.Init", "Ldex.Init", str_type, &value) == True) { for_makeinit = 1; }

  if (XrmGetResource(rDB, "ldex.xsync", "Ldex.xsync", str_type, &value) == True) { xsync = True; }
#ifdef MAIKO_ENABLE_ETHERNET
  if (XrmGetResource(rDB, "ldex.EtherNet", "Ldex.EtherNet", str_type, &value) == True) {
    int b0, b1, b2, b3, b4, b5;
    (void)strncpy(tmp, value.addr, value.size);
#if defined(USE_DLPI)
    if (sscanf(tmp, "%d:%x:%x:%x:%x:%x:%x", &ether_fd, &b0, &b1, &b2, &b3, &b4, &b5) == 7)
#elif defined(USE_NIT)
    if (sscanf(tmp, "%d:%x:%x:%x:%x:%x:%x:%s", &ether_fd, &b0, &b1, &b2, &b3, &b4, &b5,
               snit.snit_ifname) == 8)
#endif /* USE_NIT */
    {
      ether_host[0] = b0;
      ether_host[1] = b1;
      ether_host[2] = b2;
      ether_host[3] = b3;
      ether_host[4] = b4;
      ether_host[5] = b5;
    } else {
      (void)fprintf(stderr, "Missing or bogus -E argument\n");
      ether_fd = -1;
      exit(1);
    }
  }
#endif /* MAIKO_ENABLE_ETHERNET */
}